

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

void md_analyze_dollar(MD_CTX *ctx,int mark_index)

{
  MD_MARK *pMVar1;
  int in_ESI;
  MD_CTX *in_RDI;
  int closer_index;
  MD_MARK *closer;
  int opener_index;
  MD_MARK *opener;
  MD_MARK *mark;
  int in_stack_ffffffffffffffd8;
  int opener_index_00;
  MD_CTX *ctx_00;
  
  pMVar1 = in_RDI->marks + in_ESI;
  if (((pMVar1->flags & 2) != 0) && (-1 < in_RDI->opener_stacks[0xf].top)) {
    ctx_00 = (MD_CTX *)(in_RDI->marks + in_RDI->opener_stacks[0xf].top);
    opener_index_00 = in_RDI->opener_stacks[0xf].top;
    if (*(MD_OFFSET *)((long)&ctx_00->text + 4) - *(MD_OFFSET *)&ctx_00->text ==
        pMVar1->end - pMVar1->beg) {
      md_mark_stack_pop(in_RDI,in_RDI->opener_stacks + 0xf);
      md_rollback(ctx_00,opener_index_00,in_stack_ffffffffffffffd8,(int)((ulong)pMVar1 >> 0x20));
      md_resolve_range(in_RDI,opener_index_00,in_ESI);
      in_RDI->opener_stacks[0xf].top = -1;
      return;
    }
  }
  if ((pMVar1->flags & 1) != 0) {
    md_mark_stack_push(in_RDI,in_RDI->opener_stacks + 0xf,in_ESI);
  }
  return;
}

Assistant:

static void
md_analyze_dollar(MD_CTX* ctx, int mark_index)
{
    MD_MARK* mark = &ctx->marks[mark_index];

    if((mark->flags & MD_MARK_POTENTIAL_CLOSER)  &&  DOLLAR_OPENERS.top >= 0) {
        /* If the potential closer has a non-matching number of $, discard */
        MD_MARK* opener = &ctx->marks[DOLLAR_OPENERS.top];
        int opener_index = DOLLAR_OPENERS.top;
        MD_MARK* closer = mark;
        int closer_index = mark_index;

        if(opener->end - opener->beg == closer->end - closer->beg) {
            /* We are the matching closer */
            md_mark_stack_pop(ctx, &DOLLAR_OPENERS);
            md_rollback(ctx, opener_index, closer_index, MD_ROLLBACK_ALL);
            md_resolve_range(ctx, opener_index, closer_index);

            /* Discard all pending openers: Latex math span do not allow
             * nesting. */
            DOLLAR_OPENERS.top = -1;
            return;
        }
    }

    if(mark->flags & MD_MARK_POTENTIAL_OPENER)
        md_mark_stack_push(ctx, &DOLLAR_OPENERS, mark_index);
}